

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O2

void tommy_trie_init(tommy_trie *trie,tommy_allocator *alloc)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    trie->bucket[lVar2] = (tommy_trie_node *)0x0;
  }
  trie->count = 0;
  trie->node_count = 0;
  trie->alloc = alloc;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_trie_init(tommy_trie* trie, tommy_allocator* alloc)
{
	tommy_uint_t i;

	for (i = 0; i < TOMMY_TRIE_BUCKET_MAX; ++i)
		trie->bucket[i] = 0;

	trie->count = 0;
	trie->node_count = 0;

	trie->alloc = alloc;
}